

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateTensorMessage
                   (Result *__return_storage_ptr__,Tensor *tensor,NeuralNetworkLayer *layer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32 uVar2;
  string *psVar3;
  pointer pcVar4;
  long *plVar5;
  long *plVar6;
  string err;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  uVar2 = (tensor->dimvalue_).current_size_;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (((int)uVar2 < 1) || (tensor->rank_ == uVar2)) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    psVar3 = (layer->name_).ptr_;
    pcVar4 = (psVar3->_M_dataplus)._M_p;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar4,pcVar4 + psVar3->_M_string_length);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x3493ab);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_a0 = *plVar6;
      lStack_98 = plVar5[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar6;
      local_b0 = (long *)*plVar5;
    }
    local_a8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_40 = *plVar6;
      lStack_38 = plVar5[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar6;
      local_50 = (long *)*plVar5;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateTensorMessage(const Specification::Tensor& tensor, const Specification::NeuralNetworkLayer& layer) {
    std::string err;
    int rank = static_cast<int>(tensor.rank());
    if (tensor.dimvalue_size() > 0) {
        if (rank != tensor.dimvalue_size()) {
            err = "Tensor in layer '" + std::string(layer.name()) + "': rank must match the length of dimValue";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (rank < 1) {
            err = "Tensor in layer '" + std::string(layer.name()) + "': rank must be positive";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}